

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O2

void __thiscall
helics::MessageTimer::updateMessage(MessageTimer *this,int32_t timerIndex,ActionMessage *mess)

{
  CLI::std::mutex::lock((mutex *)&this->timerLock);
  if ((-1 < timerIndex) &&
     (timerIndex <
      (int)((ulong)((long)(this->timers).
                          super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->timers).
                         super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
    ActionMessage::operator=
              ((this->buffers).
               super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
               _M_impl.super__Vector_impl_data._M_start + (uint)timerIndex,mess);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->timerLock);
  return;
}

Assistant:

void MessageTimer::updateMessage(int32_t timerIndex, ActionMessage mess)
{
    std::lock_guard<std::mutex> lock(timerLock);
    if ((timerIndex >= 0) && (timerIndex < static_cast<int32_t>(timers.size()))) {
        buffers[timerIndex] = std::move(mess);
    }
}